

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::BasicReporter::Result(BasicReporter *this,AssertionResult *assertionResult)

{
  bool bVar1;
  OfType OVar2;
  ostream *poVar3;
  ulong uVar4;
  string local_2a8;
  undefined1 local_288 [8];
  TextColour colour_9;
  string local_258;
  undefined1 local_238 [8];
  TextColour okAnywayColour_1;
  TextColour colour_8;
  TextColour colour_7;
  undefined1 local_1e8 [8];
  TextColour colour_6;
  allocator<char> local_1b1;
  string local_1b0;
  undefined1 local_190 [8];
  TextColour colour_5;
  allocator<char> local_159;
  string local_158;
  undefined1 local_138 [8];
  TextColour colour_4;
  TextColour colour_3;
  undefined1 local_f8 [8];
  TextColour colour_2;
  TextColour okAnywayColour;
  TextColour errorColour;
  TextColour successColour;
  undefined1 local_98 [8];
  TextColour colour_1;
  undefined1 local_60 [8];
  TextColour colour;
  SourceLineInfo local_40;
  AssertionResult *local_18;
  AssertionResult *assertionResult_local;
  BasicReporter *this_local;
  
  local_18 = assertionResult;
  assertionResult_local = (AssertionResult *)this;
  if ((((this->m_config).includeSuccessfulResults & 1U) == 0) &&
     (OVar2 = AssertionResult::getResultType(assertionResult), OVar2 == Ok)) {
    return;
  }
  startSpansLazily(this);
  AssertionResult::getSourceInfo(&local_40,local_18);
  bVar1 = SourceLineInfo::empty(&local_40);
  SourceLineInfo::~SourceLineInfo(&local_40);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    TextColour::TextColour((TextColour *)local_60,FileName);
    poVar3 = (this->m_config).stream;
    AssertionResult::getSourceInfo((SourceLineInfo *)&colour_1.m_impl,local_18);
    Catch::operator<<(poVar3,(SourceLineInfo *)&colour_1.m_impl);
    SourceLineInfo::~SourceLineInfo((SourceLineInfo *)&colour_1.m_impl);
    TextColour::~TextColour((TextColour *)local_60);
  }
  bVar1 = AssertionResult::hasExpression(local_18);
  if (bVar1) {
    TextColour::TextColour((TextColour *)local_98,OriginalExpression);
    poVar3 = (this->m_config).stream;
    AssertionResult::getExpression_abi_cxx11_((string *)&successColour.m_impl,local_18);
    std::operator<<(poVar3,(string *)&successColour.m_impl);
    std::__cxx11::string::~string((string *)&successColour.m_impl);
    bVar1 = AssertionResult::succeeded(local_18);
    if (bVar1) {
      TextColour::TextColour((TextColour *)&errorColour.m_impl,Success);
      std::operator<<((this->m_config).stream," succeeded");
      TextColour::~TextColour((TextColour *)&errorColour.m_impl);
    }
    else {
      TextColour::TextColour((TextColour *)&okAnywayColour.m_impl,Error);
      std::operator<<((this->m_config).stream," failed");
      bVar1 = AssertionResult::isOk(local_18);
      if (bVar1) {
        TextColour::TextColour((TextColour *)&colour_2.m_impl,Success);
        std::operator<<((this->m_config).stream," - but was ok");
        TextColour::~TextColour((TextColour *)&colour_2.m_impl);
      }
      TextColour::~TextColour((TextColour *)&okAnywayColour.m_impl);
    }
    TextColour::~TextColour((TextColour *)local_98);
  }
  OVar2 = AssertionResult::getResultType(local_18);
  if (1 < (uint)(OVar2 + Info)) {
    if (OVar2 == Info) {
      TextColour::TextColour((TextColour *)local_138,ReconstructedExpression);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"info",&local_159);
      AssertionResult::getMessage_abi_cxx11_((string *)&colour_5.m_impl,local_18);
      streamVariableLengthText(this,&local_158,(string *)&colour_5.m_impl);
      std::__cxx11::string::~string((string *)&colour_5.m_impl);
      std::__cxx11::string::~string((string *)&local_158);
      std::allocator<char>::~allocator(&local_159);
      TextColour::~TextColour((TextColour *)local_138);
      goto LAB_0016ecd6;
    }
    if (OVar2 == Warning) {
      TextColour::TextColour((TextColour *)local_190,ReconstructedExpression);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"warning",&local_1b1);
      AssertionResult::getMessage_abi_cxx11_((string *)&colour_6.m_impl,local_18);
      streamVariableLengthText(this,&local_1b0,(string *)&colour_6.m_impl);
      std::__cxx11::string::~string((string *)&colour_6.m_impl);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::allocator<char>::~allocator(&local_1b1);
      TextColour::~TextColour((TextColour *)local_190);
      goto LAB_0016ecd6;
    }
    if (1 < (uint)(OVar2 + 0xfffffff0)) {
      if (OVar2 == ExplicitFailure) {
        TextColour::TextColour((TextColour *)local_1e8,Error);
        poVar3 = std::operator<<((this->m_config).stream,"failed with message: \'");
        AssertionResult::getMessage_abi_cxx11_((string *)&colour_7.m_impl,local_18);
        poVar3 = std::operator<<(poVar3,(string *)&colour_7.m_impl);
        std::operator<<(poVar3,"\'");
        std::__cxx11::string::~string((string *)&colour_7.m_impl);
        TextColour::~TextColour((TextColour *)local_1e8);
        goto LAB_0016ecd6;
      }
      if (OVar2 != Exception) {
        if (OVar2 == ThrewException) {
          TextColour::TextColour((TextColour *)local_f8,Error);
          bVar1 = AssertionResult::hasExpression(local_18);
          if (bVar1) {
            std::operator<<((this->m_config).stream," with unexpected");
          }
          else {
            std::operator<<((this->m_config).stream,"Unexpected");
          }
          poVar3 = std::operator<<((this->m_config).stream," exception with message: \'");
          AssertionResult::getMessage_abi_cxx11_((string *)&colour_3.m_impl,local_18);
          poVar3 = std::operator<<(poVar3,(string *)&colour_3.m_impl);
          std::operator<<(poVar3,"\'");
          std::__cxx11::string::~string((string *)&colour_3.m_impl);
          TextColour::~TextColour((TextColour *)local_f8);
        }
        else if (OVar2 == DidntThrowException) {
          TextColour::TextColour((TextColour *)&colour_4.m_impl,Error);
          bVar1 = AssertionResult::hasExpression(local_18);
          if (bVar1) {
            std::operator<<((this->m_config).stream,
                            " because no exception was thrown where one was expected");
          }
          else {
            std::operator<<((this->m_config).stream,"No exception thrown where one was expected");
          }
          TextColour::~TextColour((TextColour *)&colour_4.m_impl);
        }
        goto LAB_0016ecd6;
      }
    }
  }
  bVar1 = AssertionResult::hasExpression(local_18);
  if (!bVar1) {
    bVar1 = AssertionResult::succeeded(local_18);
    if (bVar1) {
      TextColour::TextColour((TextColour *)&colour_8.m_impl,Success);
      std::operator<<((this->m_config).stream," succeeded");
      TextColour::~TextColour((TextColour *)&colour_8.m_impl);
    }
    else {
      TextColour::TextColour((TextColour *)&okAnywayColour_1.m_impl,Error);
      std::operator<<((this->m_config).stream," failed");
      bVar1 = AssertionResult::isOk(local_18);
      if (bVar1) {
        TextColour::TextColour((TextColour *)local_238,Success);
        std::operator<<((this->m_config).stream," - but was ok");
        TextColour::~TextColour((TextColour *)local_238);
      }
      TextColour::~TextColour((TextColour *)&okAnywayColour_1.m_impl);
    }
  }
LAB_0016ecd6:
  bVar1 = AssertionResult::hasExpandedExpression(local_18);
  if (bVar1) {
    std::operator<<((this->m_config).stream," for: ");
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_258,local_18);
    uVar4 = std::__cxx11::string::size();
    std::__cxx11::string::~string((string *)&local_258);
    if (0x28 < uVar4) {
      std::operator<<((this->m_config).stream,"\n");
      AssertionResult::getExpandedExpression_abi_cxx11_((string *)&colour_9.m_impl,local_18);
      uVar4 = std::__cxx11::string::size();
      std::__cxx11::string::~string((string *)&colour_9.m_impl);
      if (uVar4 < 0x46) {
        std::operator<<((this->m_config).stream,"\t");
      }
    }
    TextColour::TextColour((TextColour *)local_288,ReconstructedExpression);
    poVar3 = (this->m_config).stream;
    AssertionResult::getExpandedExpression_abi_cxx11_(&local_2a8,local_18);
    std::operator<<(poVar3,(string *)&local_2a8);
    std::__cxx11::string::~string((string *)&local_2a8);
    TextColour::~TextColour((TextColour *)local_288);
  }
  std::ostream::operator<<((this->m_config).stream,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

virtual void Result( const AssertionResult& assertionResult ) {
            if( !m_config.includeSuccessfulResults && assertionResult.getResultType() == ResultWas::Ok )
                return;

            startSpansLazily();

            if( !assertionResult.getSourceInfo().empty() ) {
                TextColour colour( TextColour::FileName );
                m_config.stream << assertionResult.getSourceInfo();
            }

            if( assertionResult.hasExpression() ) {
                TextColour colour( TextColour::OriginalExpression );
                m_config.stream << assertionResult.getExpression();
                if( assertionResult.succeeded() ) {
                    TextColour successColour( TextColour::Success );
                    m_config.stream << " succeeded";
                }
                else {
                    TextColour errorColour( TextColour::Error );
                    m_config.stream << " failed";
                    if( assertionResult.isOk() ) {
                        TextColour okAnywayColour( TextColour::Success );
                        m_config.stream << " - but was ok";
                    }
                }
            }
            switch( assertionResult.getResultType() ) {
                case ResultWas::ThrewException:
                    {
                        TextColour colour( TextColour::Error );
                        if( assertionResult.hasExpression() )
                            m_config.stream << " with unexpected";
                        else
                            m_config.stream << "Unexpected";
                        m_config.stream << " exception with message: '" << assertionResult.getMessage() << "'";
                    }
                    break;
                case ResultWas::DidntThrowException:
                    {
                        TextColour colour( TextColour::Error );
                        if( assertionResult.hasExpression() )
                            m_config.stream << " because no exception was thrown where one was expected";
                        else
                            m_config.stream << "No exception thrown where one was expected";
                    }
                    break;
                case ResultWas::Info:
                    {
                        TextColour colour( TextColour::ReconstructedExpression );
                        streamVariableLengthText( "info", assertionResult.getMessage() );
                    }
                    break;
                case ResultWas::Warning:
                    {
                        TextColour colour( TextColour::ReconstructedExpression );
                        streamVariableLengthText( "warning", assertionResult.getMessage() );
                    }
                    break;
                case ResultWas::ExplicitFailure:
                    {
                        TextColour colour( TextColour::Error );
                        m_config.stream << "failed with message: '" << assertionResult.getMessage() << "'";
                    }
                    break;
                case ResultWas::Unknown: // These cases are here to prevent compiler warnings
                case ResultWas::Ok:
                case ResultWas::FailureBit:
                case ResultWas::ExpressionFailed:
                case ResultWas::Exception:
                    if( !assertionResult.hasExpression() ) {
                        if( assertionResult.succeeded() ) {
                            TextColour colour( TextColour::Success );
                            m_config.stream << " succeeded";
                        }
                        else {
                            TextColour colour( TextColour::Error );
                            m_config.stream << " failed";
                            if( assertionResult.isOk() ) {
                                TextColour okAnywayColour( TextColour::Success );
                                m_config.stream << " - but was ok";
                            }
                        }
                    }
                    break;
            }

            if( assertionResult.hasExpandedExpression() ) {
                m_config.stream << " for: ";
                if( assertionResult.getExpandedExpression().size() > 40 ) {
                    m_config.stream << "\n";
                    if( assertionResult.getExpandedExpression().size() < 70 )
                        m_config.stream << "\t";
                }
                TextColour colour( TextColour::ReconstructedExpression );
                m_config.stream << assertionResult.getExpandedExpression();
            }
            m_config.stream << std::endl;
        }